

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignalBenchmarks.hpp
# Opt level: O3

void benchmarks::SignalBenchmarks<descriptors::signal::wigwag::Ui>::HandlerSize
               (BenchmarkContext *context)

{
  SignalType *pSVar1;
  ulong uVar2;
  ulong *puVar3;
  ulong uVar4;
  __sighandler_t extraout_RDX;
  __sighandler_t extraout_RDX_00;
  __sighandler_t extraout_RDX_01;
  __sighandler_t __handler;
  int __sig;
  string *name;
  SignalType s;
  HandlerType handler;
  StorageArray<wigwag::token> c;
  SignalType local_80;
  undefined1 local_78 [32];
  _Any_data local_58;
  code *local_48;
  code *local_40;
  StorageArray<wigwag::token> local_30;
  anon_class_8_1_54a39803 local_20;
  
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_40 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/koplyarov[P]wigwag/src/benchmarks/descriptors/signal/wigwag.hpp:36:45)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/koplyarov[P]wigwag/src/benchmarks/descriptors/signal/wigwag.hpp:36:45)>
             ::_M_manager;
  local_80._impl._s._ptr._raw =
       (creation_storage_adapter<wigwag::creation::lazy::storage<wigwag::detail::intrusive_ptr<wigwag::detail::signal_impl<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::ref_counter::single_threaded>_>,_wigwag::detail::signal_impl<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::ref_counter::single_threaded>_>_>
        )(storage<wigwag::detail::intrusive_ptr<wigwag::detail::signal_impl<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::ref_counter::single_threaded>_>,_wigwag::detail::signal_impl<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::ref_counter::single_threaded>_>
          )0x0;
  uVar2 = context->_iterationsCount;
  uVar4 = 0xffffffffffffffff;
  if (uVar2 * 8 < 0xfffffffffffffff8) {
    uVar4 = uVar2 * 8 + 8;
  }
  local_30._size = uVar2;
  puVar3 = (ulong *)operator_new__(-(ulong)(uVar2 >> 0x3d != 0) | uVar4);
  *puVar3 = uVar2;
  local_30._arr = (Storage<wigwag::token> *)(puVar3 + 1);
  local_78._0_8_ = &local_80;
  local_78._8_8_ = &local_58;
  StorageArray<wigwag::token>::
  Construct<benchmarks::SignalBenchmarks<descriptors::signal::wigwag::Ui>::HandlerSize(benchmarks::BenchmarkContext&)::_lambda()_1_>
            (&local_30,(anon_class_16_2_8e986c60 *)local_78);
  pSVar1 = (SignalType *)(local_78 + 0x10);
  local_78._0_8_ = pSVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"handler","");
  (*context->_vptr_BenchmarkContext[2])(context,local_78,context->_iterationsCount);
  if ((SignalType *)local_78._0_8_ != pSVar1) {
    operator_delete((void *)local_78._0_8_);
  }
  local_78._0_8_ = pSVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"disconnect","");
  name = (string *)local_78;
  local_20.c = &local_30;
  BenchmarkContext::
  Profile<benchmarks::SignalBenchmarks<descriptors::signal::wigwag::Ui>::HandlerSize(benchmarks::BenchmarkContext&)::_lambda()_2_>
            (context,name,context->_iterationsCount,&local_20);
  __sig = (int)name;
  __handler = extraout_RDX;
  if ((SignalType *)local_78._0_8_ != pSVar1) {
    operator_delete((void *)local_78._0_8_);
    __handler = extraout_RDX_00;
  }
  if (local_30._arr != (Storage<wigwag::token> *)0x0) {
    operator_delete__(local_30._arr + -1);
    __handler = extraout_RDX_01;
  }
  wigwag::
  signal<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::creation::lazy,_wigwag::ref_counter::single_threaded>
  ::~signal(&local_80,__sig,__handler);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  return;
}

Assistant:

static void HandlerSize(BenchmarkContext& context)
        {
            HandlerType handler = SignalsDesc_::MakeHandler();
            SignalType s;
            StorageArray<ConnectionType> c(context.GetIterationsCount());

            c.Construct([&]{ return s.connect(handler); });
            context.MeasureMemory("handler", context.GetIterationsCount());
            context.Profile("disconnect", context.GetIterationsCount(), [&]{ c.Destruct(); });
        }